

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

void uv__pipe_close(uv_pipe_t *handle)

{
  if (handle->pipe_fname != (char *)0x0) {
    unlink(handle->pipe_fname);
    uv__free(handle->pipe_fname);
    handle->pipe_fname = (char *)0x0;
  }
  uv__stream_close((uv_stream_t *)handle);
  return;
}

Assistant:

void uv__pipe_close(uv_pipe_t* handle) {
  if (handle->pipe_fname) {
    /*
     * Unlink the file system entity before closing the file descriptor.
     * Doing it the other way around introduces a race where our process
     * unlinks a socket with the same name that's just been created by
     * another thread or process.
     */
    unlink(handle->pipe_fname);
    uv__free((void*)handle->pipe_fname);
    handle->pipe_fname = NULL;
  }

  uv__stream_close((uv_stream_t*)handle);
}